

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipleScatter.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ostream *poVar9;
  FILE *pFVar10;
  RandomGen *pRVar11;
  long *plVar12;
  long lVar13;
  uint uVar14;
  char *pcVar15;
  ulong uVar16;
  ulong uVar17;
  double dVar18;
  double local_230;
  double local_228;
  double local_218;
  double local_210;
  vector<double,_std::allocator<double>_> S1b;
  vector<double,_std::allocator<double>_> S1a;
  vector<double,_std::allocator<double>_> S2a_corFactor;
  vector<double,_std::allocator<double>_> S1a_corFactor;
  vector<double,_std::allocator<double>_> S2a;
  double m2;
  double m;
  vector<double,_std::allocator<double>_> S2b_corFactor;
  vector<double,_std::allocator<double>_> S1b_corFactor;
  vector<double,_std::allocator<double>_> S2b;
  double n2;
  double j2;
  double n;
  double j;
  double k2;
  double k;
  double l2;
  double i2;
  double h2;
  double g2;
  double f2;
  double e2;
  double d2;
  double c2;
  double b2;
  double a2;
  double l;
  double i;
  double h;
  double g;
  double f;
  double e;
  double d;
  double c;
  double b;
  double a;
  
  if (argc < 4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "This program aims to take execNEST outputs, and combine energy deposits into Double Scatters. "
               ,0x5e);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
    std::ostream::put('h');
    poVar9 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Usage: ",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    poVar9 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,
               "./multipleScatter <nEvents> <nScatters> <Pulse Type> <File 1> <optional: File 2> ",
               0x51);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"  -- <nEvents> is the number of events to stitch together. ",
               0x3b);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "  -- <nScatters> is the number of energy deposits to combine; use -1 for a random exponential draw. "
               ,100);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "  -- <Pulse Type> is either 0 (for uncorrected pulses) or 1 (for corrected pulses); corrected pulses sum S2s and take an S2-weighted average S1c. "
               ,0x92);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "  -- <File 1> is execNEST output events used to stitch together multiple scatters.",
               0x52);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "  -- <File 2> is optional, and will be the last scatter in each event, if provided."
               ,0x53);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    iVar3 = 1;
  }
  else {
    iVar3 = atoi(argv[1]);
    uVar4 = atoi(argv[2]);
    iVar5 = atoi(argv[3]);
    if (0 < verbosity) {
      if (iVar5 == 0) {
        pcVar15 = "S1 [phd]\tS2 [phd]\tnScatters";
        lVar13 = 0x1b;
      }
      else {
        pcVar15 = "S1c [phd]\tS2c [phd]\tnScatters";
        lVar13 = 0x1d;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar15,lVar13);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
      std::ostream::put(-0x38);
      std::ostream::flush();
    }
    pFVar10 = fopen(argv[4],"r");
    S1a.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    S1a.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    S1a.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    S2a.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    S2a.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    S2a.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    S1a_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    S1a_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    S1a_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    S2a_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    S2a_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    S2a_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if ((0 < verbosity) && (iVar6 = getc(pFVar10), iVar6 != -1)) {
      do {
        iVar7 = getc(pFVar10);
        bVar2 = iVar6 != 0x5d;
        if (iVar7 == -1) break;
        iVar6 = iVar7;
      } while (iVar7 != 10 || bVar2);
    }
    while( true ) {
      __isoc99_fscanf(pFVar10,"%lf\t%lf\t%lf\t%lf,%lf,%lf\t%lf\t%lf\t%lf\t%lf\t%lf\t%lf\t%lf\t%lf",
                      &a,&b,&c,&d,&e,&f,&g,&h,&i,&j,&k,&l,&m,&n);
      iVar6 = feof(pFVar10);
      if (iVar6 != 0) break;
      if ((1.0 < ABS(n)) && (1.0 < ABS(m))) {
        S1b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)((ulong)j & 0x7fffffffffffffff);
        if (S1a.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            S1a.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&S1a,(iterator)
                          S1a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish,(double *)&S1b);
        }
        else {
          *S1a.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish = ABS(j);
          S1a.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish = S1a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        S1b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)((ulong)m & 0x7fffffffffffffff);
        if (S2a.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            S2a.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&S2a,(iterator)
                          S2a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish,(double *)&S1b);
        }
        else {
          *S2a.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish = ABS(m);
          S2a.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish = S2a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        S1b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)ABS(k / j);
        if (S1a_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            S1a_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&S1a_corFactor,
                     (iterator)
                     S1a_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,(double *)&S1b);
        }
        else {
          *S1a_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish =
               (double)S1b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
          S1a_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               S1a_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        S1b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)ABS(n / m);
        if (S2a_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            S2a_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&S2a_corFactor,
                     (iterator)
                     S2a_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,(double *)&S1b);
        }
        else {
          *S2a_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish =
               (double)S1b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
          S2a_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               S2a_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
    }
    fclose(pFVar10);
    if (argc < 6) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Generating multiple scatters from file...",0x29);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
      std::ostream::put('h');
      std::ostream::flush();
      if (0 < iVar3) {
        uVar16 = (long)S1a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)S1a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
        iVar6 = 0;
        uVar1 = uVar4;
        do {
          while ((int)uVar1 < 2) {
            pRVar11 = RandomGen::rndm();
            dVar18 = RandomGen::rand_exponential(pRVar11,1.0,1.5,50.0);
            uVar1 = (int)(dVar18 + 0.5);
          }
          iVar7 = uVar1 + (uVar1 == 0);
          local_218 = 0.0;
          local_230 = 0.0;
          local_228 = 0.0;
          do {
            pRVar11 = RandomGen::rndm();
            iVar8 = RandomGen::integer_range(pRVar11,0,(int)(uVar16 >> 3) + -1);
            dVar18 = S2a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar8];
            if (iVar5 != 0) {
              dVar18 = dVar18 * S2a_corFactor.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start[iVar8];
              local_218 = local_218 +
                          S1a_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar8] * dVar18;
            }
            local_230 = local_230 + dVar18;
            local_228 = local_228 +
                        S1a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar8];
            iVar7 = iVar7 + -1;
          } while (iVar7 != 0);
          if (iVar5 != 0) {
            local_228 = local_228 * (local_218 / local_230);
          }
          poVar9 = std::ostream::_M_insert<double>(local_228);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t",1);
          poVar9 = std::ostream::_M_insert<double>(local_230);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t",1);
          plVar12 = (long *)std::ostream::operator<<(poVar9,uVar1);
          std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
          std::ostream::put((char)plVar12);
          std::ostream::flush();
          iVar6 = iVar6 + 1;
          if ((int)uVar4 < 2) {
            uVar1 = 0xffffffff;
          }
        } while (iVar6 != iVar3);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Using two files to generate scatters...",0x27);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
      std::ostream::put('h');
      std::ostream::flush();
      pFVar10 = fopen(argv[5],"r");
      S1b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      S1b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      S1b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      S2b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      S2b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      S2b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      S1b_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      S1b_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      S1b_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      S2b_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      S2b_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      S2b_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      if ((0 < verbosity) && (iVar6 = getc(pFVar10), iVar6 != -1)) {
        do {
          iVar7 = getc(pFVar10);
          bVar2 = iVar6 != 0x5d;
          if (iVar7 == -1) break;
          iVar6 = iVar7;
        } while (iVar7 != 10 || bVar2);
      }
      while( true ) {
        __isoc99_fscanf(pFVar10,"%lf\t%lf\t%lf\t%lf,%lf,%lf\t%lf\t%lf\t%lf\t%lf\t%lf\t%lf\t%lf\t%lf"
                        ,&a2,&b2,&c2,&d2,&e2,&f2,&g2,&h2,&i2,&j2,&k2,&l2,&m2,&n2);
        iVar6 = feof(pFVar10);
        if (iVar6 != 0) break;
        if ((1.0 < ABS(n2)) && (1.0 < ABS(m2))) {
          local_210 = ABS(j2);
          if (S1b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              S1b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (&S1b,(iterator)
                            S1b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish,&local_210);
          }
          else {
            *S1b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
             ._M_finish = ABS(j2);
            S1b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_finish = S1b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          local_210 = ABS(m2);
          if (S2b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              S2b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (&S2b,(iterator)
                            S2b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish,&local_210);
          }
          else {
            *S2b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
             ._M_finish = ABS(m2);
            S2b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_finish = S2b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          local_210 = ABS(k2 / j2);
          if (S1b_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              S1b_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (&S1b_corFactor,
                       (iterator)
                       S1b_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_210);
          }
          else {
            *S1b_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish = local_210;
            S1b_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 S1b_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_210 = ABS(n2 / m2);
          if (S2b_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              S2b_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (&S2b_corFactor,
                       (iterator)
                       S2b_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_210);
          }
          else {
            *S2b_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish = local_210;
            S2b_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 S2b_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
      }
      fclose(pFVar10);
      if (0 < iVar3) {
        uVar17 = (long)S1b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)S1b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
        uVar16 = (long)S1a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)S1a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
        iVar6 = 0;
        uVar1 = uVar4;
        do {
          while ((int)uVar1 < 2) {
            pRVar11 = RandomGen::rndm();
            dVar18 = RandomGen::rand_exponential(pRVar11,1.0,1.5,50.0);
            uVar1 = (int)(dVar18 + 0.5);
          }
          local_218 = 0.0;
          local_230 = 0.0;
          local_228 = 0.0;
          if (1 < uVar1) {
            uVar14 = 2;
            if (2 < (int)uVar1) {
              uVar14 = uVar1;
            }
            iVar7 = uVar14 - 1;
            local_228 = 0.0;
            local_230 = 0.0;
            local_218 = 0.0;
            do {
              pRVar11 = RandomGen::rndm();
              iVar8 = RandomGen::integer_range(pRVar11,0,(int)(uVar16 >> 3) + -1);
              dVar18 = S2a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar8];
              if (iVar5 != 0) {
                dVar18 = dVar18 * S2a_corFactor.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start[iVar8];
                local_218 = local_218 +
                            S1a_corFactor.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start[iVar8] * dVar18;
              }
              local_230 = local_230 + dVar18;
              local_228 = local_228 +
                          S1a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar8];
              iVar7 = iVar7 + -1;
            } while (iVar7 != 0);
          }
          pRVar11 = RandomGen::rndm();
          iVar7 = RandomGen::integer_range(pRVar11,0,(int)(uVar17 >> 3) + -1);
          local_228 = local_228 +
                      S1b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar7];
          if (iVar5 == 0) {
            local_230 = local_230 +
                        S2b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar7];
          }
          else {
            dVar18 = S2b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar7] *
                     S2b_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar7];
            local_230 = local_230 + dVar18;
            local_228 = local_228 *
                        ((dVar18 * S1b_corFactor.super__Vector_base<double,_std::allocator<double>_>
                                   ._M_impl.super__Vector_impl_data._M_start[iVar7] + local_218) /
                        local_230);
          }
          poVar9 = std::ostream::_M_insert<double>(local_228);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t",1);
          poVar9 = std::ostream::_M_insert<double>(local_230);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\t",1);
          plVar12 = (long *)std::ostream::operator<<(poVar9,uVar1);
          std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
          std::ostream::put((char)plVar12);
          std::ostream::flush();
          if ((int)uVar4 < 2) {
            uVar1 = 0xffffffff;
          }
          iVar6 = iVar6 + 1;
        } while (iVar6 != iVar3);
      }
      if (S2b_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(S2b_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)S2b_corFactor.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)S2b_corFactor.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (S1b_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(S1b_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)S1b_corFactor.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)S1b_corFactor.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (S2b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(S2b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)S2b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)S2b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (S1b.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(S1b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)S1b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)S1b.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    if (S2a_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(S2a_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)S2a_corFactor.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)S2a_corFactor.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (S1a_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(S1a_corFactor.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)S1a_corFactor.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)S1a_corFactor.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (S2a.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(S2a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)S2a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)S2a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (S1a.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(S1a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)S1a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)S1a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int main(int argc, char **argv) {
  if (argc < 4) {
    cerr << "This program aims to take execNEST outputs, and combine energy "
            "deposits into Double Scatters. "
         << endl;
    cerr << endl
         << "Usage: " << endl
         << "./multipleScatter <nEvents> <nScatters> <Pulse Type> <File 1> "
            "<optional: File 2> "
         << endl;

    cerr << "  -- <nEvents> is the number of events to stitch together. "
         << endl;
    cerr << "  -- <nScatters> is the number of energy deposits to combine; use "
            "-1 for a random exponential draw. "
         << endl;
    cerr << "  -- <Pulse Type> is either 0 (for uncorrected pulses) or 1 (for "
            "corrected pulses); corrected pulses sum S2s and take an "
            "S2-weighted average S1c. "
         << endl;
    cerr << "  -- <File 1> is execNEST output events used to stitch together "
            "multiple scatters."
         << endl;
    cerr << "  -- <File 2> is optional, and will be the last scatter in each "
            "event, if provided."
         << endl;
    return 1;
  }
  // Load the number of events
  int nEvents = atoi(argv[1]);
  int nScatters = atoi(argv[2]);
  // RandomGen::rndm()->SetSeed(time(nullptr));
  bool randomScatters = false;
  if (nScatters < 2) {
    randomScatters = true;
  }
  // define parameters for random exponential draw of nScatters
  // if using nScatters = -1.
  // These are just 0th order fill-ins to produce a spread of values.
  double halfLife = 1.;
  double minScatters = 1.5;  // int-rounding will make the true minimum = 2
  double maxScatters = 50.;
  // Check if using corrected or uncorrected output pulse areas
  bool corrected = true;
  if (atoi(argv[3]) == 0) corrected = false;
  if (verbosity > 0) {
    if (corrected)
      cout << "S1c [phd]\tS2c [phd]\tnScatters" << endl;
    else
      cout << "S1 [phd]\tS2 [phd]\tnScatters" << endl;
  }
  bool sameFile = true;
  if (argc > 5) {
    sameFile = false;
    // cerr << "Using two files to generate scatters." << endl;
  }
  // open the first file and get the S1, S2, and their correction factors
  FILE *file1 = fopen(argv[4], "r");
  double a, b, c, d, e, f, g, h, i, j, k, l, m, n;
  int ch, nLines = 0;
  vector<double> S1a, S2a;
  vector<double> S1a_corFactor, S2a_corFactor;
  if (verbosity > 0) {
    while (EOF != (ch = getc(file1))) {
      if ('\n' == ch && nLines)
        break;
      else
        nLines = 0;
      if (']' == ch && nLines == 0) ++nLines;
    }
  }
  while (1) {
    int scan = fscanf(
        file1,
        "%lf\t%lf\t%lf\t%lf,%lf,%lf\t%lf\t%lf\t%lf\t%lf\t%lf\t%lf\t%lf\t%lf",
        &a, &b, &c, &d, &e, &f, &g, &h, &i, &j, &k, &l, &m, &n);
    if (feof(file1)) break;
    // fprintf(stderr,"%.6f\t%.6f\t%.6f\t%.6f,%.6f,%.6f\t%.6f\t%.6f\t%.6f\t%.6f\t%.6f\t%.6f\t%.6f\t%.6f\n",a,b,c,d,e,f,g,h,i,j,k,l,m,n);
    if ((fabs(n) > 1.) && (fabs(m) > 1.)) {
      S1a.push_back(fabs(j));
      S2a.push_back(fabs(m));
      S1a_corFactor.push_back(fabs(k / j));
      S2a_corFactor.push_back(fabs(n / m));
    }
  }  // Done with the first file....
  fclose(file1);
  if (!sameFile) {
    cerr << "Using two files to generate scatters..." << endl;
    // Load the 2nd file if provided, and stitch the two together to make
    // multiple scatter events scatters
    FILE *file2 = fopen(argv[5], "r");
    nLines = 0;
    double a2, b2, c2, d2, e2, f2, g2, h2, i2, j2, k2, l2, m2, n2;
    vector<double> S1b, S2b;
    vector<double> S1b_corFactor, S2b_corFactor;
    if (verbosity > 0) {
      while (EOF != (ch = getc(file2))) {
        if ('\n' == ch && nLines)
          break;
        else
          nLines = 0;
        if (']' == ch && nLines == 0) ++nLines;
      }
    }

    while (1) {
      int scan2 = fscanf(
          file2,
          "%lf\t%lf\t%lf\t%lf,%lf,%lf\t%lf\t%lf\t%lf\t%lf\t%lf\t%lf\t%lf\t%lf",
          &a2, &b2, &c2, &d2, &e2, &f2, &g2, &h2, &i2, &j2, &k2, &l2, &m2, &n2);
      if (feof(file2)) break;
      // fprintf(stderr,"%.6f\t%.6f\t%.6f\t%.6f,%.6f,%.6f\t%.6f\t%.6f\t%.6f\t%.6f\t%.6f\t%.6f\t%.6f\t%.6f\n",a,b,c,d,e,f,g,h,i,j,k,l,m,n);
      if ((fabs(n2) > 1.) &&
          (fabs(m2) > 1.)) {      // prevent loading events where S2 ~ PHE_MIN
        S1b.push_back(fabs(j2));  // was causing memory leaks
        S2b.push_back(fabs(m2));
        S1b_corFactor.push_back(fabs(k2 / j2));
        S2b_corFactor.push_back(fabs(n2 / m2));
      }
    }  // Done with the second file
    fclose(file2);

    auto size1 = S1a.size();
    auto size2 = S1b.size();
    double totalS1, totalS2, totalCorFactor;
    double thisS1a, thisS1b, thisS2a, thisS2b;
    double thisS1a_corFactor, thisS2a_corFactor, thisS1b_corFactor,
        thisS2b_corFactor;
    for (int ii = 0; ii < nEvents; ii++) {
      while (nScatters < 2) {
        nScatters =  // 0th order attempt at reproducing multiple scatter
                     // behavior
            (int)(RandomGen::rndm()->rand_exponential(halfLife, minScatters,
                                                      maxScatters) +
                  0.5);
      }
      totalS1 = 0.;
      totalCorFactor = 0.;
      totalS2 = 0.;
      for (int jj = 0; jj < nScatters - 1; jj++) {
        // randomly draw an energy deposit from the first file
        int index = RandomGen::rndm()->integer_range(0, (int)size1 - 1);

        thisS1a = S1a[index];
        thisS2a = S2a[index];
        thisS1a_corFactor = S1a_corFactor[index];
        thisS2a_corFactor = S2a_corFactor[index];
        if (corrected) {
          double cor_S2a = thisS2a * thisS2a_corFactor;
          totalS2 += cor_S2a;
          totalS1 += thisS1a;
          totalCorFactor += thisS1a_corFactor * cor_S2a;
        } else {
          totalS1 += thisS1a;
          totalS2 += thisS2a;
        }
      }  // now on to the last scatter from the 2nd file
      int index2 = RandomGen::rndm()->integer_range(0, (int)size2 - 1);
      thisS1b = S1b[index2];
      thisS2b = S2b[index2];
      thisS1b_corFactor = S1b_corFactor[index2];
      thisS2b_corFactor = S2b_corFactor[index2];

      if (corrected) {
        double cor_S2b = thisS2b * thisS2b_corFactor;
        totalS2 += cor_S2b;
        totalS1 += thisS1b;
        totalCorFactor += thisS1b_corFactor * cor_S2b;
        totalS1 *= totalCorFactor / totalS2;
      } else {
        totalS1 += thisS1b;
        totalS2 += thisS2b;
      }
      cout << totalS1 << "\t" << totalS2 << "\t" << nScatters
           << endl;  //"\t" << thisS1a << "  " << thisS1b << " " << thisS2a << "
                     //" << thisS2b << endl;
      if (randomScatters) nScatters = -1;
    }
    return 0;
  } else {
    cerr << "Generating multiple scatters from file..." << endl;
    // Drawing both scatters from the same file...
    int nGenerated = 0;

    auto size1 = S1a.size();
    double totalS1, totalS2, totalCorFactor;
    double thisS1a, thisS1b, thisS2a, thisS2b;
    double thisS1a_corFactor, thisS2a_corFactor, thisS1b_corFactor,
        thisS2b_corFactor;

    while (nGenerated < nEvents) {
      while (nScatters < 2) {
        nScatters =  // 0th order attempt at reproducing multiple scatter
                     // behavior
            (int)(RandomGen::rndm()->rand_exponential(halfLife, minScatters,
                                                      maxScatters) +
                  0.5);
      }
      totalS1 = 0.;
      totalCorFactor = 0.;
      totalS2 = 0.;
      for (int jj = 0; jj < nScatters; jj++) {
        // randomly draw an energy deposit from the first file
        int index = RandomGen::rndm()->integer_range(0, (int)size1 - 1);

        thisS1a = S1a[index];
        thisS2a = S2a[index];
        thisS1a_corFactor = S1a_corFactor[index];
        thisS2a_corFactor = S2a_corFactor[index];
        if (corrected) {
          double cor_S2a = thisS2a * thisS2a_corFactor;
          totalS2 += cor_S2a;
          totalS1 += thisS1a;
          totalCorFactor += thisS1a_corFactor * cor_S2a;
        } else {
          totalS1 += thisS1a;
          totalS2 += thisS2a;
        }
      }
      if (corrected)
        totalS1 *= totalCorFactor / totalS2;  // S2c-weighted average corrected
                                              // S1

      cout << totalS1 << "\t" << totalS2 << "\t" << nScatters
           << endl;  //"\t" << thisS1a << "  " << thisS1b << " " << thisS2a << "
                     //" << thisS2b << endl;
      nGenerated++;
      if (randomScatters) nScatters = -1;
    }
    return 0;
  }
}